

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

bool __thiscall
cfd::ConfidentialTransactionContext::IsFindOutPoint
          (ConfidentialTransactionContext *this,
          vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *list,OutPoint *outpoint
          )

{
  bool bVar1;
  OutPoint *in_RDX;
  OutPoint *target;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *__range1;
  vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *in_stack_ffffffffffffffb8;
  reference in_stack_ffffffffffffffc0;
  __normal_iterator<const_cfd::core::OutPoint_*,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>
  local_30 [2];
  OutPoint *local_20;
  
  local_20 = in_RDX;
  local_30[0]._M_current =
       (OutPoint *)
       std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::begin
                 (in_stack_ffffffffffffffb8);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::end
            (in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cfd::core::OutPoint_*,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_cfd::core::OutPoint_*,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) {
      return false;
    }
    in_stack_ffffffffffffffc0 =
         __gnu_cxx::
         __normal_iterator<const_cfd::core::OutPoint_*,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>
         ::operator*(local_30);
    bVar1 = core::OutPoint::operator==(local_20,in_stack_ffffffffffffffc0);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_cfd::core::OutPoint_*,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>
    ::operator++(local_30);
  }
  return true;
}

Assistant:

bool ConfidentialTransactionContext::IsFindOutPoint(
    const std::vector<OutPoint>& list, const OutPoint& outpoint) const {
  for (const auto& target : list) {
    if (outpoint == target) return true;
  }
  return false;
}